

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_unix.cpp
# Opt level: O0

bool __thiscall File::size(File *this,int64_t *fileSize)

{
  bool bVar1;
  int iVar2;
  undefined1 local_b0 [8];
  stat buf;
  bool res;
  int64_t *fileSize_local;
  File *this_local;
  
  buf.__glibc_reserved[2]._7_1_ = 0;
  bVar1 = isOpen(this);
  if (bVar1) {
    iVar2 = anon_unknown.dwarf_2ffb82::to_fd(this->m_impl);
    iVar2 = fstat64(iVar2,(stat64 *)local_b0);
    if (iVar2 == 0) {
      *fileSize = buf.st_rdev;
      buf.__glibc_reserved[2]._7_1_ = 1;
    }
  }
  return (bool)(buf.__glibc_reserved[2]._7_1_ & 1);
}

Assistant:

bool File::size(int64_t* const fileSize) const
{
    bool res = false;

    struct stat buf;

    if (isOpen() && (fstat(to_fd(m_impl), &buf) == 0))
    {
        *fileSize = buf.st_size;
        res = true;
    }

    return res;
}